

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printImm(MCInst *MI,SStream *O,int64_t imm,_Bool positive)

{
  char cVar1;
  undefined4 uVar2;
  _Bool _Var3;
  byte in_CL;
  ulong in_RDX;
  SStream *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint64_t local_18;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe4);
  if ((in_CL & 1) == 0) {
    if (*(int *)(*(long *)(in_RDI + 800) + 0x68) == 4) {
      if ((long)in_RDX < 0) {
        if (in_RDX == 0x8000000000000000) {
          SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff)
                          ,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        }
        else if ((long)in_RDX < -9) {
          _Var3 = need_zero_prefix(in_RDX);
          if (_Var3) {
            SStream_concat(in_RSI,"-0%lxh",-in_RDX);
          }
          else {
            SStream_concat(in_RSI,"-%lxh",-in_RDX);
          }
        }
        else {
          SStream_concat(in_RSI,"-%lu",-in_RDX);
        }
      }
      else if ((long)in_RDX < 10) {
        SStream_concat(in_RSI,"%lu",in_RDX);
      }
      else {
        _Var3 = need_zero_prefix(in_RDX);
        if (_Var3) {
          SStream_concat(in_RSI,"0%lxh",in_RDX);
        }
        else {
          SStream_concat(in_RSI,"%lxh",in_RDX);
        }
      }
    }
    else if ((long)in_RDX < 0) {
      if (in_RDX == 0x8000000000000000) {
        SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                        (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      else if ((long)in_RDX < -9) {
        SStream_concat(in_RSI,"-0x%lx",-in_RDX);
      }
      else {
        SStream_concat(in_RSI,"-%lu",-in_RDX);
      }
    }
    else if ((long)in_RDX < 10) {
      SStream_concat(in_RSI,"%lu",in_RDX);
    }
    else {
      SStream_concat(in_RSI,"0x%lx",in_RDX);
    }
  }
  else {
    local_18 = in_RDX;
    if (*(int *)(*(long *)(in_RDI + 800) + 0x68) == 4) {
      if ((long)in_RDX < 0) {
        if (*(char *)(in_RDI + 6) != '\0') {
          in_stack_ffffffffffffffe0 = (uint)*(byte *)(in_RDI + 6);
          if (in_stack_ffffffffffffffe0 == 1) {
            local_18 = in_RDX & 0xff;
          }
          else if (in_stack_ffffffffffffffe0 == 2) {
            local_18 = in_RDX & 0xffff;
          }
          else if (in_stack_ffffffffffffffe0 == 4) {
            local_18 = in_RDX & 0xffffffff;
          }
        }
        if (local_18 == 0x8000000000000000) {
          SStream_concat0((SStream *)(CONCAT44(uVar2,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff)
                          ,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        }
        else {
          _Var3 = need_zero_prefix(local_18);
          if (_Var3) {
            SStream_concat(in_RSI,"0%lxh",local_18);
          }
          else {
            SStream_concat(in_RSI,"%lxh",local_18);
          }
        }
      }
      else if ((long)in_RDX < 10) {
        SStream_concat(in_RSI,"%lu",in_RDX);
      }
      else {
        _Var3 = need_zero_prefix(in_RDX);
        if (_Var3) {
          SStream_concat(in_RSI,"0%lxh",in_RDX);
        }
        else {
          SStream_concat(in_RSI,"%lxh",in_RDX);
        }
      }
    }
    else if ((long)in_RDX < 0) {
      if (*(char *)(in_RDI + 6) != '\0') {
        cVar1 = *(char *)(in_RDI + 6);
        if (cVar1 == '\x01') {
          local_18 = in_RDX & 0xff;
        }
        else if (cVar1 == '\x02') {
          local_18 = in_RDX & 0xffff;
        }
        else if (cVar1 == '\x04') {
          local_18 = in_RDX & 0xffffffff;
        }
      }
      SStream_concat(in_RSI,"0x%lx",local_18);
    }
    else if ((long)in_RDX < 10) {
      SStream_concat(in_RSI,"%lu",in_RDX);
    }
    else {
      SStream_concat(in_RSI,"0x%lx",in_RDX);
    }
  }
  return;
}

Assistant:

static void printImm(MCInst *MI, SStream *O, int64_t imm, bool positive)
{
	if (positive) {
		// always print this number in positive form
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (need_zero_prefix(imm))
					SStream_concat(O, "0%"PRIx64"h", imm);
				else
					SStream_concat(O, "%"PRIx64"h", imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				SStream_concat(O, "0x%"PRIx64, imm);
			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	} else {
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (imm < -HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "-0%"PRIx64"h", -imm);
					else
						SStream_concat(O, "-%"PRIx64"h", -imm);
				} else
					SStream_concat(O, "-%"PRIu64, -imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "0x8000000000000000");
				else if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "-%"PRIu64, -imm);

			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	}
}